

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate_stream.cpp
# Opt level: O0

string * __thiscall
boost::deflate::inflate_stream_test::corpus2_abi_cxx11_
          (string *__return_storage_ptr__,inflate_stream_test *this,size_t n)

{
  uniform_int_distribution<unsigned_int> local_13c0;
  uniform_int_distribution<unsigned_int> d0;
  mt19937 g;
  inflate_stream_test *local_18;
  size_t n_local;
  string *s;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)&d0);
  std::uniform_int_distribution<unsigned_int>::uniform_int_distribution(&local_13c0,0,0xff);
  local_18 = this;
  while (local_18 != (inflate_stream_test *)0x0) {
    std::uniform_int_distribution<unsigned_int>::operator()
              (&local_13c0,
               (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                *)&d0);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    local_18 = (inflate_stream_test *)
               ((long)&local_18[-1].beast_decompressor.is.super_inflate_stream.distbits_ + 3);
  }
  return __return_storage_ptr__;
}

Assistant:

static
    std::string corpus2(std::size_t n)
    {
        std::string s;
        s.reserve(n);
        std::mt19937 g;
        std::uniform_int_distribution<std::uint32_t> d0{0, 255};
        while(n--)
            s.push_back(static_cast<char>(d0(g)));
        return s;
    }